

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

bool __thiscall
SchemePrimitiveProcedure::is_eq(SchemePrimitiveProcedure *this,shared_ptr<SchemeObject> *a)

{
  bool bVar1;
  element_type *peVar2;
  __type_conflict local_29;
  undefined1 local_28 [8];
  shared_ptr<SchemePrimitiveProcedure> p;
  shared_ptr<SchemeObject> *a_local;
  SchemePrimitiveProcedure *this_local;
  
  p.super___shared_ptr<SchemePrimitiveProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a;
  std::dynamic_pointer_cast<SchemePrimitiveProcedure,SchemeObject>
            ((shared_ptr<SchemeObject> *)local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  local_29 = false;
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<SchemePrimitiveProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SchemePrimitiveProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    local_29 = std::operator==(&(this->super_SchemeProcedure).name,
                               &(peVar2->super_SchemeProcedure).name);
  }
  std::shared_ptr<SchemePrimitiveProcedure>::~shared_ptr
            ((shared_ptr<SchemePrimitiveProcedure> *)local_28);
  return local_29;
}

Assistant:

bool SchemePrimitiveProcedure::is_eq(const std::shared_ptr<SchemeObject> &a) const
{
    auto p = std::dynamic_pointer_cast<SchemePrimitiveProcedure>(a);
    return p && name == p->name;
}